

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

NeuralNetworkPreprocessing * __thiscall
CoreML::Specification::NeuralNetworkPreprocessing::New
          (NeuralNetworkPreprocessing *this,Arena *arena)

{
  NeuralNetworkPreprocessing *this_00;
  
  this_00 = (NeuralNetworkPreprocessing *)operator_new(0x28);
  NeuralNetworkPreprocessing(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::NeuralNetworkPreprocessing>(arena,this_00);
  }
  return this_00;
}

Assistant:

NeuralNetworkPreprocessing* NeuralNetworkPreprocessing::New(::google::protobuf::Arena* arena) const {
  NeuralNetworkPreprocessing* n = new NeuralNetworkPreprocessing;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}